

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::DataTable
          (DataTable *this,AttachedDatabase *db,
          shared_ptr<duckdb::TableIOManager,_true> *table_io_manager_p,string *schema,string *table,
          vector<duckdb::ColumnDefinition,_true> *column_definitions_p,
          unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
          *data)

{
  shared_ptr<duckdb::RowGroupCollection,_true> *this_00;
  pointer pCVar1;
  vector<duckdb::LogicalType,_true> *args_2;
  pointer pPVar2;
  RowGroupCollection *pRVar3;
  type data_00;
  vector<duckdb::LogicalType,_true> types;
  shared_ptr<duckdb::DataTableInfo,_true> local_48;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->db = db;
  make_shared_ptr<duckdb::DataTableInfo,duckdb::AttachedDatabase&,duckdb::shared_ptr<duckdb::TableIOManager,true>,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((AttachedDatabase *)&this->info,(shared_ptr<duckdb::TableIOManager,_true> *)db,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)table_io_manager_p
             ,schema);
  pCVar1 = (column_definitions_p->
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start =
       (column_definitions_p->
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = pCVar1;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (column_definitions_p->
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (column_definitions_p->
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (column_definitions_p->
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (column_definitions_p->
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->row_groups).internal.
           super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       0;
  *(undefined8 *)
   ((long)&(this->row_groups).internal.
           super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 4) = 0;
  (this->append_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  *(undefined8 *)((long)&(this->append_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->append_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->append_lock).super___mutex_base._M_mutex + 8) = 0;
  GetTypes((vector<duckdb::LogicalType,_true> *)&local_38,this);
  args_2 = (vector<duckdb::LogicalType,_true> *)GetTableIOManager(this);
  make_shared_ptr<duckdb::RowGroupCollection,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,duckdb::TableIOManager&,duckdb::vector<duckdb::LogicalType,true>&,int>
            (&local_48,(TableIOManager *)&this->info,args_2,(int *)&local_38);
  this_00 = &this->row_groups;
  shared_ptr<duckdb::RowGroupCollection,_true>::operator=
            (this_00,(shared_ptr<duckdb::RowGroupCollection,_true> *)&local_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.internal.
              super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((data->
      super_unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PersistentTableData_*,_std::default_delete<duckdb::PersistentTableData>_>
      .super__Head_base<0UL,_duckdb::PersistentTableData_*,_false>._M_head_impl !=
      (PersistentTableData *)0x0) {
    pPVar2 = unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
             ::operator->(data);
    if (pPVar2->row_group_count != 0) {
      pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
      data_00 = unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
                ::operator*(data);
      RowGroupCollection::Initialize(pRVar3,data_00);
      goto LAB_005573a9;
    }
  }
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
  RowGroupCollection::InitializeEmpty(pRVar3);
LAB_005573a9:
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
  RowGroupCollection::Verify(pRVar3);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  return;
}

Assistant:

DataTable::DataTable(AttachedDatabase &db, shared_ptr<TableIOManager> table_io_manager_p, const string &schema,
                     const string &table, vector<ColumnDefinition> column_definitions_p,
                     unique_ptr<PersistentTableData> data)
    : db(db), info(make_shared_ptr<DataTableInfo>(db, std::move(table_io_manager_p), schema, table)),
      column_definitions(std::move(column_definitions_p)), version(DataTableVersion::MAIN_TABLE) {
	// initialize the table with the existing data from disk, if any
	auto types = GetTypes();
	auto &io_manager = TableIOManager::Get(*this);
	this->row_groups = make_shared_ptr<RowGroupCollection>(info, io_manager, types, 0);
	if (data && data->row_group_count > 0) {
		this->row_groups->Initialize(*data);
	} else {
		this->row_groups->InitializeEmpty();
		D_ASSERT(row_groups->GetTotalRows() == 0);
	}
	row_groups->Verify();
}